

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

unique_ptr<pg::Game,_std::default_delete<pg::Game>_> __thiscall
pg::Game::extract_subgame
          (Game *this,bitset *mask,vector<int,_std::allocator<int>_> *subgame_to_game)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  size_t sVar5;
  ostream *poVar6;
  reference pvVar7;
  mapped_type_conflict *pmVar8;
  pointer pGVar9;
  vector<int,_std::allocator<int>_> *in_RCX;
  size_type __n;
  _label_vertex _Var10;
  key_type_conflict1 *local_158;
  int *curedge_2;
  int local_148;
  int v_2;
  int w_1;
  undefined1 local_120 [16];
  string local_110;
  undefined1 local_f0 [24];
  int w;
  int v_1;
  int vertices;
  value_type_conflict3 local_c4;
  undefined1 local_c0 [8];
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> game_to_subgame;
  _label_vertex local_78;
  int *local_68;
  int *curedge_1;
  int local_58;
  _label_vertex local_50;
  int *local_40;
  int *curedge;
  int iStack_30;
  bool bad;
  int v;
  int ne;
  int nv;
  vector<int,_std::allocator<int>_> *subgame_to_game_local;
  bitset *mask_local;
  Game *this_local;
  __single_object *res;
  
  _ne = in_RCX;
  subgame_to_game_local = subgame_to_game;
  mask_local = mask;
  this_local = this;
  sVar5 = bitset::count((bitset *)subgame_to_game);
  v = (int)sVar5;
  iStack_30 = 0;
  curedge._4_4_ = 0;
  do {
    if ((long)mask->_bits <= (long)curedge._4_4_) {
      game_to_subgame._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
      std::make_unique<pg::Game,int&,int&>((int *)this,&v);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_c0);
      local_c4 = 0;
      std::vector<int,_std::allocator<int>_>::assign(_ne,(size_type)mask->_bits,&local_c4);
      w = 0;
      for (local_f0._20_4_ = 0; (long)(int)local_f0._20_4_ < (long)mask->_bits;
          local_f0._20_4_ = local_f0._20_4_ + 1) {
        bVar4 = bitset::operator[]((bitset *)subgame_to_game_local,(long)(int)local_f0._20_4_);
        uVar3 = local_f0._20_4_;
        if (bVar4) {
          local_f0._16_4_ = w;
          __n = (size_type)w;
          w = w + 1;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_ne,__n);
          uVar2 = local_f0._16_4_;
          *pvVar7 = uVar3;
          pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                               *)local_c0,(key_type_conflict1 *)(local_f0 + 0x14));
          *pmVar8 = uVar2;
          if (*(long *)(mask[1]._allocsize + (long)(int)local_f0._20_4_ * 8) == 0) {
            pGVar9 = std::unique_ptr<pg::Game,_std::default_delete<pg::Game>_>::operator->
                               ((unique_ptr<pg::Game,_std::default_delete<pg::Game>_> *)this);
            uVar3 = local_f0._16_4_;
            iVar1 = *(int *)(mask->_bitssize + (long)(int)local_f0._20_4_ * 4);
            bitset::operator[]((bitset *)local_120,(size_t)&mask->_allocsize);
            bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_120);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&w_1,"",(allocator<char> *)((long)&v_2 + 3));
            init_vertex(pGVar9,uVar3,iVar1,(uint)bVar4,(string *)&w_1);
            std::__cxx11::string::~string((string *)&w_1);
            std::allocator<char>::~allocator((allocator<char> *)((long)&v_2 + 3));
          }
          else {
            pGVar9 = std::unique_ptr<pg::Game,_std::default_delete<pg::Game>_>::operator->
                               ((unique_ptr<pg::Game,_std::default_delete<pg::Game>_> *)this);
            uVar3 = local_f0._16_4_;
            iVar1 = *(int *)(mask->_bitssize + (long)(int)local_f0._20_4_ * 4);
            bitset::operator[]((bitset *)local_f0,(size_t)&mask->_allocsize);
            bVar4 = bitset::reference::operator_cast_to_bool((reference *)local_f0);
            std::__cxx11::string::string
                      ((string *)(local_120 + 0x10),
                       *(string **)(mask[1]._allocsize + (long)(int)local_f0._20_4_ * 8));
            init_vertex(pGVar9,uVar3,iVar1,(uint)bVar4,(string *)(local_120 + 0x10));
            std::__cxx11::string::~string((string *)(local_120 + 0x10));
          }
        }
      }
      for (local_148 = 0; local_148 < v; local_148 = local_148 + 1) {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](_ne,(long)local_148);
        iVar1 = *pvVar7;
        pGVar9 = std::unique_ptr<pg::Game,_std::default_delete<pg::Game>_>::operator->
                           ((unique_ptr<pg::Game,_std::default_delete<pg::Game>_> *)this);
        e_start(pGVar9,local_148);
        for (local_158 = outs((Game *)mask,iVar1); *local_158 != -1; local_158 = local_158 + 1) {
          bVar4 = bitset::operator[]((bitset *)subgame_to_game_local,(long)*local_158);
          if (bVar4) {
            pGVar9 = std::unique_ptr<pg::Game,_std::default_delete<pg::Game>_>::operator->
                               ((unique_ptr<pg::Game,_std::default_delete<pg::Game>_> *)this);
            pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)local_c0,local_158);
            e_add(pGVar9,local_148,*pmVar8);
          }
        }
        pGVar9 = std::unique_ptr<pg::Game,_std::default_delete<pg::Game>_>::operator->
                           ((unique_ptr<pg::Game,_std::default_delete<pg::Game>_> *)this);
        e_finish(pGVar9);
      }
      game_to_subgame._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 local_c0);
      if ((game_to_subgame._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
        std::unique_ptr<pg::Game,_std::default_delete<pg::Game>_>::~unique_ptr
                  ((unique_ptr<pg::Game,_std::default_delete<pg::Game>_> *)this);
      }
      return (__uniq_ptr_data<pg::Game,_std::default_delete<pg::Game>,_true,_true>)
             (__uniq_ptr_data<pg::Game,_std::default_delete<pg::Game>,_true,_true>)this;
    }
    bVar4 = bitset::operator[]((bitset *)subgame_to_game_local,(long)curedge._4_4_);
    if (bVar4) {
      curedge._3_1_ = 1;
      for (local_40 = outs((Game *)mask,curedge._4_4_); *local_40 != -1; local_40 = local_40 + 1) {
        bVar4 = bitset::operator[]((bitset *)subgame_to_game_local,(long)*local_40);
        if (bVar4) {
          curedge._3_1_ = 0;
          iStack_30 = iStack_30 + 1;
        }
      }
      if ((curedge._3_1_ & 1) != 0) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"no successor for vertex ");
        _Var10 = label_vertex((Game *)mask,curedge._4_4_);
        curedge_1 = (int *)_Var10.g;
        local_58 = _Var10.v;
        local_50.g = (Game *)curedge_1;
        local_50.v = local_58;
        poVar6 = operator<<(poVar6,&local_50);
        poVar6 = std::operator<<(poVar6," in extract_subgame!");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        std::operator<<((ostream *)&std::cerr,"successors not in subgame:");
        for (local_68 = outs((Game *)mask,curedge._4_4_); *local_68 != -1; local_68 = local_68 + 1)
        {
          poVar6 = std::operator<<((ostream *)&std::cerr," ");
          _Var10 = label_vertex((Game *)mask,*local_68);
          local_78.g = _Var10.g;
          local_78.v = _Var10.v;
          operator<<(poVar6,&local_78);
        }
        std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        abort();
      }
    }
    curedge._4_4_ = curedge._4_4_ + 1;
  } while( true );
}

Assistant:

std::unique_ptr<Game>
Game::extract_subgame(const bitset& mask, std::vector<int>& subgame_to_game)
{
    // check if there are any dead ends (not allowed)
    // also count the number of edges in the subgame

    int nv = mask.count();
    int ne = 0;
    for (int v=0; v<n_vertices; v++) {
        if (mask[v]) {
            bool bad = true;
            for (auto curedge = outs(v); *curedge != -1; curedge++) {
                if (mask[*curedge]) {
                    bad = false;
                    ne++;
                }
            }
            if (bad) {
                std::cerr << "no successor for vertex " << label_vertex(v) << " in extract_subgame!" << std::endl;
                std::cerr << "successors not in subgame:";
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    std::cerr << " " << label_vertex(*curedge);
                }
                std::cerr << std::endl;
                abort(); // bad!
            }
        }
    }

    auto res = std::make_unique<Game>(nv, ne);

    // create mapping from game to subgame
    // also count the number of vertices in the subgame
    std::map<int, int> game_to_subgame;
    subgame_to_game.assign(n_vertices, 0);

    int vertices = 0;
    for (int v=0; v<n_vertices; v++) {
        if (!mask[v]) continue;

        // update game_to_subgame and subgame_to_game
        int w = vertices++;
        subgame_to_game[w] = v;
        game_to_subgame[v] = w;

        // initialize most stuff (except edges)
        if (_label[v] != 0) res->init_vertex(w, _priority[v], _owner[v], *_label[v]);
        else res->init_vertex(w, _priority[v], _owner[v], "");
    }

    // now add all edges

    for (int w=0; w<nv; w++) {
        int v = subgame_to_game[w];
        res->e_start(w);
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            if (mask[*curedge]) res->e_add(w, game_to_subgame[*curedge]);
        }
        res->e_finish();
    }

    // TODO: fix is_ordered?

    return res;
}